

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testInit
          (VaryingLocationAliasingWithMixedTypesTest *this)

{
  vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
  *this_00;
  pointer *pptVar1;
  iterator iVar2;
  Type TVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  GLuint GVar8;
  GLuint goten;
  uint uVar9;
  GLuint GVar10;
  VaryingLocationAliasingWithMixedTypesTest *this_01;
  TYPES TVar11;
  uint uVar12;
  STAGES SVar13;
  Type TVar14;
  Type TVar15;
  TYPES local_a0;
  testCase local_98;
  testCase local_70;
  GLuint local_48;
  GLuint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  TVar3.m_n_rows = local_98.m_type_gohan.m_n_rows;
  TVar3._0_8_ = local_98.m_type_gohan._0_8_;
  this_00 = &this->m_test_cases;
  local_48 = 0;
  this_01 = this;
  do {
    local_98.m_type_gohan = TVar3;
    TVar14 = TestBase::getType((TestBase *)this_01,local_48);
    GVar8 = TVar14.m_n_rows;
    uVar7 = TVar14._0_8_;
    TVar3 = local_98.m_type_gohan;
    if ((uVar7 & 0xffffffff00000000) == 0x100000000) {
      local_3c = 4 - GVar8;
      GVar10 = 0;
      do {
        local_a0 = TVar14.m_basic_type;
        local_44 = GVar10;
        local_98.m_type_gohan = TVar3;
        TVar15 = TestBase::getType((TestBase *)this_01,GVar10);
        GVar10 = TVar15.m_n_rows;
        TVar11 = TVar15.m_basic_type;
        TVar3 = local_98.m_type_gohan;
        if ((((TVar15._0_8_ & 0xffffffff00000000) == 0x100000000) &&
            (local_a0 < Int != TVar11 < Int)) && (GVar8 + GVar10 < 5)) {
          local_40 = 1 - GVar10;
          SVar13 = COMPUTE;
          do {
            if (SVar13 != COMPUTE) {
              bVar6 = SVar13 != FRAGMENT || TVar11 != Double && local_a0 != Double;
              uVar12 = 0;
              uVar9 = local_40;
              do {
                uVar4 = local_70.m_type_goten._4_8_;
                local_34 = 1;
                if (1 < (int)uVar9) {
                  local_34 = uVar9;
                }
                local_70.m_type_goten._4_8_ = TVar15._4_8_;
                uVar5 = local_70.m_type_goten._4_8_;
                local_70.m_type_goten._4_8_ = uVar4;
                local_38 = uVar9;
                if (uVar12 - GVar10 < 0x7fffffff) {
                  uVar9 = 0;
                  do {
                    local_70.m_is_input = true;
                    local_98._8_4_ = local_98._8_4_ & 0xffffff00;
                    iVar2._M_current =
                         (this->m_test_cases).
                         super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    local_98.m_component_goten = uVar9;
                    local_70.m_component_goten = uVar9;
                    if (iVar2._M_current ==
                        (this->m_test_cases).
                        super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      this_01 = (VaryingLocationAliasingWithMixedTypesTest *)this_00;
                      local_98.m_component_gohan = uVar12;
                      local_98.m_stage = SVar13;
                      local_98.m_type_goten.m_basic_type = TVar11;
                      local_98.m_type_goten._4_8_ = uVar5;
                      local_70.m_component_gohan = uVar12;
                      local_70.m_stage = SVar13;
                      local_70.m_type_goten.m_basic_type = TVar11;
                      local_70.m_type_goten._4_8_ = uVar5;
                      local_98.m_type_gohan = TVar14;
                      local_70.m_type_gohan = TVar14;
                      std::
                      vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>>
                      ::
                      _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase_const&>
                                ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>>
                                  *)this_00,iVar2,&local_70);
                      TVar3 = local_98.m_type_gohan;
                    }
                    else {
                      local_70.m_type_goten.m_n_columns = (GLuint)uVar5;
                      local_70.m_type_goten.m_n_rows = SUB84(uVar5,4);
                      ((iVar2._M_current)->m_type_goten).m_n_columns =
                           local_70.m_type_goten.m_n_columns;
                      ((iVar2._M_current)->m_type_goten).m_n_rows = local_70.m_type_goten.m_n_rows;
                      ((iVar2._M_current)->m_type_gohan).m_basic_type = (int)uVar7;
                      ((iVar2._M_current)->m_type_gohan).m_n_columns = (int)(uVar7 >> 0x20);
                      *(ulong *)&((iVar2._M_current)->m_type_gohan).m_n_rows =
                           CONCAT44(TVar11,GVar8);
                      (iVar2._M_current)->m_component_gohan = uVar12;
                      (iVar2._M_current)->m_component_goten = uVar9;
                      (iVar2._M_current)->m_is_input = true;
                      *(undefined3 *)&(iVar2._M_current)->field_0x9 = local_70._9_3_;
                      (iVar2._M_current)->m_stage = SVar13;
                      pptVar1 = &(this->m_test_cases).
                                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *pptVar1 = *pptVar1 + 1;
                      local_98.m_component_gohan = uVar12;
                      local_98.m_stage = SVar13;
                      local_98.m_type_goten.m_basic_type = TVar11;
                      local_98.m_type_goten._4_8_ = uVar5;
                      local_70.m_component_gohan = uVar12;
                      local_70.m_stage = SVar13;
                      local_70.m_type_goten.m_basic_type = TVar11;
                      local_70.m_type_goten._4_8_ = uVar5;
                      TVar3 = TVar14;
                      local_70.m_type_gohan = TVar14;
                    }
                    local_98.m_type_gohan.m_n_rows = TVar3.m_n_rows;
                    local_98.m_type_gohan._0_8_ = TVar3._0_8_;
                    if (bVar6) {
                      iVar2._M_current =
                           (this->m_test_cases).
                           super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar2._M_current ==
                          (this->m_test_cases).
                          super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        this_01 = (VaryingLocationAliasingWithMixedTypesTest *)this_00;
                        local_98.m_type_gohan = TVar3;
                        std::
                        vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>>
                        ::
                        _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase_const&>
                                  ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>>
                                    *)this_00,iVar2,&local_98);
                        TVar3 = local_98.m_type_gohan;
                      }
                      else {
                        ((iVar2._M_current)->m_type_goten).m_n_columns =
                             local_98.m_type_goten.m_n_columns;
                        ((iVar2._M_current)->m_type_goten).m_n_rows = local_98.m_type_goten.m_n_rows
                        ;
                        ((iVar2._M_current)->m_type_gohan).m_basic_type =
                             local_98.m_type_gohan.m_basic_type;
                        ((iVar2._M_current)->m_type_gohan).m_n_columns =
                             local_98.m_type_gohan.m_n_columns;
                        *(ulong *)&((iVar2._M_current)->m_type_gohan).m_n_rows =
                             CONCAT44(local_98.m_type_goten.m_basic_type,
                                      local_98.m_type_gohan.m_n_rows);
                        (iVar2._M_current)->m_component_gohan = local_98.m_component_gohan;
                        (iVar2._M_current)->m_component_goten = local_98.m_component_goten;
                        (iVar2._M_current)->m_is_input = (bool)local_98.m_is_input;
                        *(int3 *)&(iVar2._M_current)->field_0x9 = local_98._9_3_;
                        (iVar2._M_current)->m_stage = local_98.m_stage;
                        pptVar1 = &(this->m_test_cases).
                                   super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *pptVar1 = *pptVar1 + 1;
                      }
                    }
                    uVar9 = uVar9 + 1;
                  } while (local_34 != uVar9);
                }
                for (uVar9 = GVar8 + uVar12; uVar9 <= 4 - GVar10; uVar9 = uVar9 + 1) {
                  local_70.m_is_input = true;
                  local_98._8_4_ = local_98._8_4_ & 0xffffff00;
                  iVar2._M_current =
                       (this->m_test_cases).
                       super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_98.m_component_goten = uVar9;
                  local_70.m_component_goten = uVar9;
                  if (iVar2._M_current ==
                      (this->m_test_cases).
                      super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    this_01 = (VaryingLocationAliasingWithMixedTypesTest *)this_00;
                    local_98.m_component_gohan = uVar12;
                    local_98.m_stage = SVar13;
                    local_98.m_type_goten.m_basic_type = TVar11;
                    local_98.m_type_goten._4_8_ = uVar5;
                    local_70.m_component_gohan = uVar12;
                    local_70.m_stage = SVar13;
                    local_70.m_type_goten.m_basic_type = TVar11;
                    local_70.m_type_goten._4_8_ = uVar5;
                    local_98.m_type_gohan = TVar14;
                    local_70.m_type_gohan = TVar14;
                    std::
                    vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>>
                    ::
                    _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase_const&>
                              ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>>
                                *)this_00,iVar2,&local_70);
                    TVar3 = local_98.m_type_gohan;
                  }
                  else {
                    local_70.m_type_goten.m_n_columns = (GLuint)uVar5;
                    local_70.m_type_goten.m_n_rows = SUB84(uVar5,4);
                    ((iVar2._M_current)->m_type_goten).m_n_columns =
                         local_70.m_type_goten.m_n_columns;
                    ((iVar2._M_current)->m_type_goten).m_n_rows = local_70.m_type_goten.m_n_rows;
                    ((iVar2._M_current)->m_type_gohan).m_basic_type = (int)uVar7;
                    ((iVar2._M_current)->m_type_gohan).m_n_columns = (int)(uVar7 >> 0x20);
                    *(ulong *)&((iVar2._M_current)->m_type_gohan).m_n_rows = CONCAT44(TVar11,GVar8);
                    (iVar2._M_current)->m_component_gohan = uVar12;
                    (iVar2._M_current)->m_component_goten = uVar9;
                    (iVar2._M_current)->m_is_input = true;
                    *(undefined3 *)&(iVar2._M_current)->field_0x9 = local_70._9_3_;
                    (iVar2._M_current)->m_stage = SVar13;
                    pptVar1 = &(this->m_test_cases).
                               super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *pptVar1 = *pptVar1 + 1;
                    local_98.m_component_gohan = uVar12;
                    local_98.m_stage = SVar13;
                    local_98.m_type_goten.m_basic_type = TVar11;
                    local_98.m_type_goten._4_8_ = uVar5;
                    local_70.m_component_gohan = uVar12;
                    local_70.m_stage = SVar13;
                    local_70.m_type_goten.m_basic_type = TVar11;
                    local_70.m_type_goten._4_8_ = uVar5;
                    TVar3 = TVar14;
                    local_70.m_type_gohan = TVar14;
                  }
                  local_98.m_type_gohan.m_n_rows = TVar3.m_n_rows;
                  local_98.m_type_gohan._0_8_ = TVar3._0_8_;
                  if (bVar6) {
                    iVar2._M_current =
                         (this->m_test_cases).
                         super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    if (iVar2._M_current ==
                        (this->m_test_cases).
                        super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      this_01 = (VaryingLocationAliasingWithMixedTypesTest *)this_00;
                      local_98.m_type_gohan = TVar3;
                      std::
                      vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>>
                      ::
                      _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase_const&>
                                ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>>
                                  *)this_00,iVar2,&local_98);
                      TVar3 = local_98.m_type_gohan;
                    }
                    else {
                      ((iVar2._M_current)->m_type_goten).m_n_columns =
                           local_98.m_type_goten.m_n_columns;
                      ((iVar2._M_current)->m_type_goten).m_n_rows = local_98.m_type_goten.m_n_rows;
                      ((iVar2._M_current)->m_type_gohan).m_basic_type =
                           local_98.m_type_gohan.m_basic_type;
                      ((iVar2._M_current)->m_type_gohan).m_n_columns =
                           local_98.m_type_gohan.m_n_columns;
                      *(ulong *)&((iVar2._M_current)->m_type_gohan).m_n_rows =
                           CONCAT44(local_98.m_type_goten.m_basic_type,
                                    local_98.m_type_gohan.m_n_rows);
                      (iVar2._M_current)->m_component_gohan = local_98.m_component_gohan;
                      (iVar2._M_current)->m_component_goten = local_98.m_component_goten;
                      (iVar2._M_current)->m_is_input = (bool)local_98.m_is_input;
                      *(int3 *)&(iVar2._M_current)->field_0x9 = local_98._9_3_;
                      (iVar2._M_current)->m_stage = local_98.m_stage;
                      pptVar1 = &(this->m_test_cases).
                                 super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *pptVar1 = *pptVar1 + 1;
                    }
                  }
                }
                uVar12 = uVar12 + 1;
                uVar9 = local_38 + 1;
              } while (uVar12 <= local_3c);
            }
            SVar13 = SVar13 + VERTEX;
          } while (SVar13 != STAGE_MAX);
        }
        GVar10 = local_44 + 1;
      } while (GVar10 != 0x22);
    }
    local_48 = local_48 + 1;
  } while (local_48 != 0x22);
  return;
}

Assistant:

void VaryingLocationAliasingWithMixedTypesTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type_gohan		   = getType(i);
		const bool		   is_float_type_gohan = isFloatType(type_gohan);

		/* Skip matrices */
		if (1 != type_gohan.m_n_columns)
		{
			continue;
		}

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& type_goten		   = getType(j);
			const bool		   is_float_type_goten = isFloatType(type_goten);

			/* Skip matrices */
			if (1 != type_goten.m_n_columns)
			{
				continue;
			}

			/* Skip valid combinations */
			if (is_float_type_gohan == is_float_type_goten)
			{
				continue;
			}

			const GLuint n_req_components_gohan = type_gohan.m_n_rows;
			const GLuint n_req_components_goten = type_goten.m_n_rows;
			const GLuint valid_component_gohan  = n_components_per_location - n_req_components_gohan;
			const GLuint valid_component_goten  = n_components_per_location - n_req_components_goten;

			/* Skip pairs that cannot fit into one location */
			if (n_components_per_location < (n_req_components_gohan + n_req_components_goten))
			{
				continue;
			}

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				/* Skip compute shader */
				if (Utils::Shader::COMPUTE == stage)
				{
					continue;
				}

				for (GLuint gohan = 0; gohan <= valid_component_gohan; ++gohan)
				{
					const GLint first_aliasing = gohan - n_req_components_goten + 1;
					const GLint last_aliasing  = gohan + n_req_components_gohan - 1;

					const GLuint goten_lower_limit = std::max(0, first_aliasing);
					const GLuint goten_upper_limit = last_aliasing + 1;

					/* Compoennets before gohan */
					for (GLuint goten = 0; goten < goten_lower_limit; ++goten)
					{
						testCase test_case_in = { gohan,	  goten,	 true, (Utils::Shader::STAGES)stage,
												  type_gohan, type_goten };
						testCase test_case_out = { gohan,	  goten,	 false, (Utils::Shader::STAGES)stage,
												   type_gohan, type_goten };

						m_test_cases.push_back(test_case_in);

						/* Skip double outputs in fragment shader */
						if ((Utils::Shader::FRAGMENT != stage) || ((Utils::Type::Double != type_gohan.m_basic_type) &&
																   (Utils::Type::Double != type_goten.m_basic_type)))
						{
							m_test_cases.push_back(test_case_out);
						}
					}

					/* Components after gohan */
					for (GLuint goten = goten_upper_limit; goten <= valid_component_goten; ++goten)
					{
						testCase test_case_in = { gohan,	  goten,	 true, (Utils::Shader::STAGES)stage,
												  type_gohan, type_goten };
						testCase test_case_out = { gohan,	  goten,	 false, (Utils::Shader::STAGES)stage,
												   type_gohan, type_goten };

						m_test_cases.push_back(test_case_in);

						/* Skip double outputs in fragment shader */
						if ((Utils::Shader::FRAGMENT != stage) || ((Utils::Type::Double != type_gohan.m_basic_type) &&
																   (Utils::Type::Double != type_goten.m_basic_type)))
						{
							m_test_cases.push_back(test_case_out);
						}
					}
				}
			}
		}
	}
}